

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

void __thiscall
QExplicitlySharedDataPointer<QSqlFieldPrivate>::~QExplicitlySharedDataPointer
          (QExplicitlySharedDataPointer<QSqlFieldPrivate> *this)

{
  QSqlFieldPrivate *pQVar1;
  Data *pDVar2;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != (QSqlFieldPrivate *)0x0) {
    LOCK();
    (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> == 0) {
      pQVar1 = (this->d).ptr;
      if (pQVar1 != (QSqlFieldPrivate *)0x0) {
        QVariant::~QVariant(&pQVar1->def);
        pDVar2 = (pQVar1->table).d.d;
        if (pDVar2 != (Data *)0x0) {
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
               (__atomic_base<int>)
               ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
          UNLOCK();
          if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
            QArrayData::deallocate(&((pQVar1->table).d.d)->super_QArrayData,2,0x10);
          }
        }
        pDVar2 = (pQVar1->nm).d.d;
        if (pDVar2 != (Data *)0x0) {
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
               (__atomic_base<int>)
               ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
          UNLOCK();
          if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
            QArrayData::deallocate(&((pQVar1->nm).d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      operator_delete(pQVar1,0x78);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }